

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall dns::Exception::~Exception(Exception *this)

{
  ~Exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~Exception() throw() { }